

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_array.c
# Opt level: O0

void * tabread4_tilde_new(t_symbol *s)

{
  t_object *owner;
  t_symbol *s_00;
  t_tabread4_tilde *x;
  t_symbol *s_local;
  
  owner = (t_object *)pd_new(tabread4_tilde_class);
  owner[1].te_binbuf = (_binbuf *)s;
  owner[1].te_g.g_next = (_gobj *)0x0;
  s_00 = gensym("signal");
  outlet_new(owner,s_00);
  floatinlet_new(owner,(t_float *)((long)&owner[1].te_outlet + 4));
  *(undefined4 *)&owner[1].te_outlet = 0;
  *(undefined4 *)((long)&owner[1].te_outlet + 4) = 0;
  return owner;
}

Assistant:

static void *tabread4_tilde_new(t_symbol *s)
{
    t_tabread4_tilde *x = (t_tabread4_tilde *)pd_new(tabread4_tilde_class);
    x->x_arrayname = s;
    x->x_vec = 0;
    outlet_new(&x->x_obj, gensym("signal"));
    floatinlet_new(&x->x_obj, &x->x_onset);
    x->x_f = 0;
    x->x_onset = 0;
    return (x);
}